

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dot_product_with_scale.c
# Opt level: O0

int32_t WebRtcSpl_DotProductWithScale(int16_t *vector1,int16_t *vector2,size_t length,int scaling)

{
  byte bVar1;
  ulong local_30;
  size_t i;
  int32_t sum;
  int scaling_local;
  size_t length_local;
  int16_t *vector2_local;
  int16_t *vector1_local;
  
  i._0_4_ = 0;
  for (local_30 = 0; bVar1 = (byte)scaling, local_30 + 3 < length; local_30 = local_30 + 4) {
    i._0_4_ = ((int)vector1[local_30 + 3] * (int)vector2[local_30 + 3] >> (bVar1 & 0x1f)) +
              ((int)vector1[local_30 + 2] * (int)vector2[local_30 + 2] >> (bVar1 & 0x1f)) +
              ((int)vector1[local_30 + 1] * (int)vector2[local_30 + 1] >> (bVar1 & 0x1f)) +
              ((int)vector1[local_30] * (int)vector2[local_30] >> (bVar1 & 0x1f)) + (int)i;
  }
  for (; local_30 < length; local_30 = local_30 + 1) {
    i._0_4_ = ((int)vector1[local_30] * (int)vector2[local_30] >> (bVar1 & 0x1f)) + (int)i;
  }
  return (int)i;
}

Assistant:

int32_t WebRtcSpl_DotProductWithScale(const int16_t* vector1,
                                      const int16_t* vector2,
                                      size_t length,
                                      int scaling) {
  int32_t sum = 0;
  size_t i = 0;

  /* Unroll the loop to improve performance. */
  for (i = 0; i + 3 < length; i += 4) {
    sum += (vector1[i + 0] * vector2[i + 0]) >> scaling;
    sum += (vector1[i + 1] * vector2[i + 1]) >> scaling;
    sum += (vector1[i + 2] * vector2[i + 2]) >> scaling;
    sum += (vector1[i + 3] * vector2[i + 3]) >> scaling;
  }
  for (; i < length; i++) {
    sum += (vector1[i] * vector2[i]) >> scaling;
  }

  return sum;
}